

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assign.cpp
# Opt level: O0

int main(void)

{
  function_type *function_pointer;
  shared_ptr<object> local_538;
  this_type local_528;
  shared_ptr<functor> local_4d8;
  callable<int_(int),_32UL> local_4c8;
  code *local_478;
  undefined8 local_470;
  this_type local_468;
  object local_409;
  undefined1 local_408 [7];
  object l_init;
  functor local_3b1;
  anon_class_8_1_54a39802_for_m_object aStack_3b0;
  functor j_init;
  this_type local_3a8;
  int local_350;
  __1 local_349;
  int b;
  anon_class_1_0_00000001_for_m_object local_2e9;
  this_type local_2e8;
  callable<int_(int),_32UL> local_298;
  callable<int_(int),_32UL> local_248;
  code *local_1f8;
  undefined8 local_1f0;
  this_type local_1e8;
  object local_191;
  code *pcStack_190;
  object object_init;
  object local_179;
  this_type local_178;
  this_type local_128;
  functor local_cd [8];
  functor functor_init;
  functor local_b9;
  callable<int_(int),_32UL> local_b8;
  undefined1 local_68 [8];
  fn a;
  
  tmf::callable<int_(int),_32UL>::callable((callable<int_(int),_32UL> *)local_68);
  tmf::callable<int_(int),_32UL>::callable<functor>(&local_b8,&local_b9);
  tmf::callable<int_(int),_32UL>::operator=((callable<int_(int),_32UL> *)local_68,&local_b8);
  tmf::callable<int_(int),_32UL>::~callable(&local_b8);
  local_cd[0] = (functor)0x0;
  tmf::callable<int(int),32ul>::callable<functor&>((callable<int(int),32ul> *)&local_128,local_cd);
  tmf::callable<int_(int),_32UL>::operator=((callable<int_(int),_32UL> *)local_68,&local_128);
  tmf::callable<int_(int),_32UL>::~callable(&local_128);
  pcStack_190 = object::method;
  tmf::callable<int(int),32ul>::callable<object,int(object::*)(int)>
            ((callable<int(int),32ul> *)&local_178,&local_179,0x102150);
  tmf::callable<int_(int),_32UL>::operator=((callable<int_(int),_32UL> *)local_68,&local_178);
  tmf::callable<int_(int),_32UL>::~callable(&local_178);
  local_191 = (object)0x0;
  local_1f8 = object::method;
  local_1f0 = 0;
  tmf::callable<int(int),32ul>::callable<object&,int(object::*)(int)>
            ((callable<int(int),32ul> *)&local_1e8,&local_191,0x102150);
  tmf::callable<int_(int),_32UL>::operator=((callable<int_(int),_32UL> *)local_68,&local_1e8);
  tmf::callable<int_(int),_32UL>::~callable(&local_1e8);
  tmf::callable<int_(int),_32UL>::callable(&local_248,free_function);
  tmf::callable<int_(int),_32UL>::operator=((callable<int_(int),_32UL> *)local_68,&local_248);
  tmf::callable<int_(int),_32UL>::~callable(&local_248);
  tmf::callable<int_(int),_32UL>::callable(&local_298,object::static_method);
  tmf::callable<int_(int),_32UL>::operator=((callable<int_(int),_32UL> *)local_68,&local_298);
  tmf::callable<int_(int),_32UL>::~callable(&local_298);
  tmf::callable<int(int),32ul>::callable<main::__0>
            ((callable<int(int),32ul> *)&local_2e8,&local_2e9);
  tmf::callable<int_(int),_32UL>::operator=((callable<int_(int),_32UL> *)local_68,&local_2e8);
  tmf::callable<int_(int),_32UL>::~callable(&local_2e8);
  function_pointer = main::$_1::operator_cast_to_function_pointer(&local_349);
  tmf::callable<int_(int),_32UL>::callable((callable<int_(int),_32UL> *)&b,function_pointer);
  tmf::callable<int_(int),_32UL>::operator=((callable<int_(int),_32UL> *)local_68,(this_type *)&b);
  tmf::callable<int_(int),_32UL>::~callable((this_type *)&b);
  local_350 = 0x2a;
  aStack_3b0.b = &local_350;
  tmf::callable<int(int),32ul>::callable<main::__2>
            ((callable<int(int),32ul> *)&local_3a8,&stack0xfffffffffffffc50);
  tmf::callable<int_(int),_32UL>::operator=((callable<int_(int),_32UL> *)local_68,&local_3a8);
  tmf::callable<int_(int),_32UL>::~callable(&local_3a8);
  tmf::callable<int_(int),_32UL>::callable<functor>
            ((callable<int_(int),_32UL> *)local_408,&local_3b1);
  tmf::callable<int_(int),_32UL>::operator=
            ((callable<int_(int),_32UL> *)local_68,(this_type *)local_408);
  tmf::callable<int_(int),_32UL>::~callable((this_type *)local_408);
  local_478 = object::method;
  local_470 = 0;
  tmf::callable<int(int),32ul>::callable<object,int(object::*)(int)>
            ((callable<int(int),32ul> *)&local_468,&local_409,0x102150);
  tmf::callable<int_(int),_32UL>::operator=((callable<int_(int),_32UL> *)local_68,&local_468);
  tmf::callable<int_(int),_32UL>::~callable(&local_468);
  std::make_shared<functor>();
  tmf::callable<int_(int),_32UL>::callable<functor>(&local_4c8,&local_4d8);
  tmf::callable<int_(int),_32UL>::operator=((callable<int_(int),_32UL> *)local_68,&local_4c8);
  tmf::callable<int_(int),_32UL>::~callable(&local_4c8);
  std::shared_ptr<functor>::~shared_ptr(&local_4d8);
  std::make_shared<object>();
  tmf::callable<int(int),32ul>::callable<object,int(object::*)(int)>
            ((callable<int(int),32ul> *)&local_528,&local_538,0x102150);
  tmf::callable<int_(int),_32UL>::operator=((callable<int_(int),_32UL> *)local_68,&local_528);
  tmf::callable<int_(int),_32UL>::~callable(&local_528);
  std::shared_ptr<object>::~shared_ptr(&local_538);
  tmf::callable<int_(int),_32UL>::~callable((callable<int_(int),_32UL> *)local_68);
  return 0;
}

Assistant:

int
main()
{
  using fn = tmf::callable<int(int)>;

  // default initialize an empty callable 'a'
  fn a{};

  // assign 'a' with a class with `int operator()(int)` defined
  // provide an rvalue to have your object possibly moved into the callable
		a = functor{};
  // you can provide an lvalue to have your instance copied into the callable
  functor functor_init{};
  a = functor_init;

  // to initialize with an arbitrary member function provide a class instance
  // and a pointer to member function
  // you can provide an rvalue to have your instance possibly moved into the
  // callable
  a = { object{}, &object::method };
  // you can provide an lvalue to have your instance copied into the callable
  object object_init{};
  a = { object_init, &object::method };

  // to initialize with a free function, provide the address of a
  // free function or static member function
  a = &free_function;
  a = &object::static_method;

  // to initialize with a lambda, simply provide the lambda
  a = [](int) { return 0; };

  // if the lambda can be downcast to a function pointer, this can reduce the storage requirements
  a = static_cast<int (*)(int)>([](int) { return 0; });

  // lambdas can capture, but keep in mind how this might effect the storage requirements
  int b = 42;
  a = [&b](int) { return b; };

  // assign a raw pointer to avoid copies and moves
  functor j_init;
  a = { &j_init };

  object l_init;
  a = { &l_init, &object::method };

  // shared_ptr is a safer way to avoid copies and moves
  a = { std::make_shared<functor>() };
  
  a = { std::make_shared<object>(), &object::method };

  return 0;
}